

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureWrapTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::TextureWrapTests::init(TextureWrapTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int extraout_EAX;
  long *plVar5;
  TextureWrapCase *pTVar6;
  int iVar7;
  long *plVar8;
  pointer pbVar9;
  size_type *psVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  long lVar15;
  string name;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  long *local_188;
  long local_180;
  long local_178;
  long lStack_170;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  npotFilenames;
  long *local_138;
  long local_130;
  long local_128;
  long lStack_120;
  long *local_118;
  long local_110;
  long local_108;
  long lStack_100;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  potFilenames;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  uint local_78;
  uint local_74;
  ulong local_70;
  long *local_68 [2];
  long local_58 [2];
  long local_48;
  long local_40;
  anon_struct_16_2_3f8b7511 *local_38;
  
  lVar11 = 0;
  do {
    local_38 = init::wrapModes + lVar11;
    local_70 = (ulong)init::wrapModes[lVar11].mode;
    lVar13 = 0;
    local_48 = lVar11;
    do {
      iVar7 = (int)local_70;
      lVar11 = 0;
      uVar3 = 0x212cc01;
      local_40 = lVar13;
      do {
        uVar4 = 0x212cc01;
        lVar12 = 0;
        local_78 = uVar3;
        do {
          lVar15 = 0;
          local_74 = uVar4;
          do {
            if ((lVar13 == 0 && iVar7 == 0x812f || (lVar15 == 0 || lVar13 == 2 && iVar7 == 0x2901))
               && ((lVar13 == 0 && iVar7 == 0x812f ||
                   (((init::sizes[lVar12].width & init::sizes[lVar12].width - 1U) == 0 &&
                    ((init::sizes[lVar12].height & init::sizes[lVar12].height - 1U) == 0)))))) {
              local_68[0] = local_58;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_68,0x1af8059);
              plVar5 = (long *)std::__cxx11::string::append((char *)local_68);
              local_98 = &local_88;
              plVar8 = plVar5 + 2;
              if ((long *)*plVar5 == plVar8) {
                local_88 = *plVar8;
                lStack_80 = plVar5[3];
              }
              else {
                local_88 = *plVar8;
                local_98 = (long *)*plVar5;
              }
              local_90 = plVar5[1];
              *plVar5 = (long)plVar8;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_98);
              potFilenames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)&potFilenames.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
              pbVar9 = (pointer)(plVar5 + 2);
              if ((pointer)*plVar5 == pbVar9) {
                potFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)(pbVar9->_M_dataplus)._M_p;
              }
              else {
                potFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)(pbVar9->_M_dataplus)._M_p;
                potFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar5;
              }
              potFilenames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar5[1];
              *plVar5 = (long)pbVar9;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&potFilenames);
              plVar8 = plVar5 + 2;
              if ((long *)*plVar5 == plVar8) {
                local_e8 = *plVar8;
                lStack_e0 = plVar5[3];
                local_f8 = &local_e8;
              }
              else {
                local_e8 = *plVar8;
                local_f8 = (long *)*plVar5;
              }
              local_f0 = plVar5[1];
              *plVar5 = (long)plVar8;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
              plVar8 = plVar5 + 2;
              if ((long *)*plVar5 == plVar8) {
                local_128 = *plVar8;
                lStack_120 = plVar5[3];
                local_138 = &local_128;
              }
              else {
                local_128 = *plVar8;
                local_138 = (long *)*plVar5;
              }
              local_130 = plVar5[1];
              *plVar5 = (long)plVar8;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_138);
              local_118 = &local_108;
              plVar8 = plVar5 + 2;
              if ((long *)*plVar5 == plVar8) {
                local_108 = *plVar8;
                lStack_100 = plVar5[3];
              }
              else {
                local_108 = *plVar8;
                local_118 = (long *)*plVar5;
              }
              local_110 = plVar5[1];
              *plVar5 = (long)plVar8;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_118);
              npotFilenames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)&npotFilenames.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
              pbVar9 = (pointer)(plVar5 + 2);
              if ((pointer)*plVar5 == pbVar9) {
                npotFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)(pbVar9->_M_dataplus)._M_p;
              }
              else {
                npotFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)(pbVar9->_M_dataplus)._M_p;
                npotFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar5;
              }
              npotFilenames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar5[1];
              *plVar5 = (long)pbVar9;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&npotFilenames);
              local_1a8 = &local_198;
              plVar8 = plVar5 + 2;
              if ((long *)*plVar5 == plVar8) {
                local_198 = *plVar8;
                lStack_190 = plVar5[3];
              }
              else {
                local_198 = *plVar8;
                local_1a8 = (long *)*plVar5;
              }
              local_1a0 = plVar5[1];
              *plVar5 = (long)plVar8;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_1a8);
              plVar8 = plVar5 + 2;
              if ((long *)*plVar5 == plVar8) {
                local_178 = *plVar8;
                lStack_170 = plVar5[3];
                local_188 = &local_178;
              }
              else {
                local_178 = *plVar8;
                local_188 = (long *)*plVar5;
              }
              local_180 = plVar5[1];
              *plVar5 = (long)plVar8;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_188);
              name._M_dataplus._M_p = (pointer)&name.field_2;
              psVar10 = (size_type *)(plVar5 + 2);
              if ((size_type *)*plVar5 == psVar10) {
                name.field_2._M_allocated_capacity = *psVar10;
                name.field_2._8_8_ = plVar5[3];
              }
              else {
                name.field_2._M_allocated_capacity = *psVar10;
                name._M_dataplus._M_p = (pointer)*plVar5;
              }
              name._M_string_length = plVar5[1];
              *plVar5 = (long)psVar10;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              if (local_188 != &local_178) {
                operator_delete(local_188,local_178 + 1);
              }
              if (local_1a8 != &local_198) {
                operator_delete(local_1a8,local_198 + 1);
              }
              if (npotFilenames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&npotFilenames.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(npotFilenames.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (ulong)((long)&((npotFilenames.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                               ->_M_dataplus)._M_p + 1));
              }
              if (local_118 != &local_108) {
                operator_delete(local_118,local_108 + 1);
              }
              if (local_138 != &local_128) {
                operator_delete(local_138,local_128 + 1);
              }
              if (local_f8 != &local_e8) {
                operator_delete(local_f8,local_e8 + 1);
              }
              if (potFilenames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&potFilenames.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(potFilenames.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (ulong)((long)&((potFilenames.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                               ->_M_dataplus)._M_p + 1));
              }
              if (local_98 != &local_88) {
                operator_delete(local_98,local_88 + 1);
              }
              if (local_68[0] != local_58) {
                operator_delete(local_68[0],local_58[0] + 1);
              }
              pTVar6 = (TextureWrapCase *)operator_new(0x118);
              pCVar1 = (this->super_TestCaseGroup).m_context;
              TextureWrapCase::TextureWrapCase
                        (pTVar6,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                                m_testCtx,pCVar1->m_renderCtx,pCVar1->m_contextInfo,
                         name._M_dataplus._M_p,::glcts::fixed_sample_locations_values + 1,
                         *(deUint32 *)((long)&init::formats[0].format + lVar15),
                         *(deUint32 *)((long)&init::formats[0].dataType + lVar15),(deUint32)local_70
                         ,init::wrapModes[lVar13].mode,init::filteringModes[lVar11].mode,
                         init::filteringModes[lVar11].mode,init::sizes[lVar12].width,
                         init::sizes[lVar12].height);
              tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar6);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)name._M_dataplus._M_p != &name.field_2) {
                operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
              }
            }
            lVar15 = lVar15 + 0x10;
          } while (lVar15 != 0x40);
          lVar12 = 1;
          uVar4 = 0;
        } while ((local_74 & 1) != 0);
        lVar11 = 1;
        uVar3 = uVar4;
      } while ((local_78 & 1) != 0);
      lVar13 = local_40 + 1;
    } while (lVar13 != 3);
    lVar11 = local_48 + 1;
  } while (lVar11 != 3);
  potFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  potFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  potFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  name._M_dataplus._M_p = (pointer)&name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&name,"data/etc1/photo_helsinki_mip_0.pkm","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&potFilenames,
             &name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != &name.field_2) {
    operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
  }
  lVar11 = 0;
  do {
    lVar13 = 0;
    do {
      lVar12 = 0;
      bVar2 = true;
      do {
        bVar14 = bVar2;
        local_f8 = &local_e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,0x1af8059);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
        local_138 = &local_128;
        plVar8 = plVar5 + 2;
        if ((long *)*plVar5 == plVar8) {
          local_128 = *plVar8;
          lStack_120 = plVar5[3];
        }
        else {
          local_128 = *plVar8;
          local_138 = (long *)*plVar5;
        }
        local_130 = plVar5[1];
        *plVar5 = (long)plVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_138);
        local_118 = &local_108;
        plVar8 = plVar5 + 2;
        if ((long *)*plVar5 == plVar8) {
          local_108 = *plVar8;
          lStack_100 = plVar5[3];
        }
        else {
          local_108 = *plVar8;
          local_118 = (long *)*plVar5;
        }
        local_110 = plVar5[1];
        *plVar5 = (long)plVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_118);
        npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pbVar9 = (pointer)(plVar5 + 2);
        if ((pointer)*plVar5 == pbVar9) {
          npotFilenames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar9->_M_dataplus)._M_p;
        }
        else {
          npotFilenames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar9->_M_dataplus)._M_p;
          npotFilenames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar5;
        }
        npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar5[1];
        *plVar5 = (long)pbVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&npotFilenames);
        local_1a8 = &local_198;
        plVar8 = plVar5 + 2;
        if ((long *)*plVar5 == plVar8) {
          local_198 = *plVar8;
          lStack_190 = plVar5[3];
        }
        else {
          local_198 = *plVar8;
          local_1a8 = (long *)*plVar5;
        }
        local_1a0 = plVar5[1];
        *plVar5 = (long)plVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_1a8);
        local_188 = &local_178;
        plVar8 = plVar5 + 2;
        if ((long *)*plVar5 == plVar8) {
          local_178 = *plVar8;
          lStack_170 = plVar5[3];
        }
        else {
          local_178 = *plVar8;
          local_188 = (long *)*plVar5;
        }
        local_180 = plVar5[1];
        *plVar5 = (long)plVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_188);
        name._M_dataplus._M_p = (pointer)&name.field_2;
        psVar10 = (size_type *)(plVar5 + 2);
        if ((size_type *)*plVar5 == psVar10) {
          name.field_2._M_allocated_capacity = *psVar10;
          name.field_2._8_8_ = plVar5[3];
        }
        else {
          name.field_2._M_allocated_capacity = *psVar10;
          name._M_dataplus._M_p = (pointer)*plVar5;
        }
        name._M_string_length = plVar5[1];
        *plVar5 = (long)psVar10;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if (local_188 != &local_178) {
          operator_delete(local_188,local_178 + 1);
        }
        if (local_1a8 != &local_198) {
          operator_delete(local_1a8,local_198 + 1);
        }
        if (npotFilenames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&npotFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(npotFilenames.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((npotFilenames.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_dataplus)._M_p + 1));
        }
        if (local_118 != &local_108) {
          operator_delete(local_118,local_108 + 1);
        }
        if (local_138 != &local_128) {
          operator_delete(local_138,local_128 + 1);
        }
        if (local_f8 != &local_e8) {
          operator_delete(local_f8,local_e8 + 1);
        }
        pTVar6 = (TextureWrapCase *)operator_new(0x118);
        pCVar1 = (this->super_TestCaseGroup).m_context;
        TextureWrapCase::TextureWrapCase
                  (pTVar6,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                   pCVar1->m_renderCtx,pCVar1->m_contextInfo,name._M_dataplus._M_p,
                   ::glcts::fixed_sample_locations_values + 1,init::wrapModes[lVar11].mode,
                   init::wrapModes[lVar13].mode,init::filteringModes[lVar12].mode,
                   init::filteringModes[lVar12].mode,&potFilenames);
        tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
        }
        lVar12 = 1;
        bVar2 = false;
      } while (bVar14);
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  npotFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  npotFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  npotFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  name._M_dataplus._M_p = (pointer)&name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&name,"data/etc1/photo_helsinki_113x89.pkm","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&npotFilenames,
             &name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != &name.field_2) {
    operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
  }
  lVar11 = 0;
  bVar2 = true;
  do {
    bVar14 = bVar2;
    local_1a8 = &local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"clamp_clamp_","");
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_1a8);
    local_188 = &local_178;
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_178 = *plVar8;
      lStack_170 = plVar5[3];
    }
    else {
      local_178 = *plVar8;
      local_188 = (long *)*plVar5;
    }
    local_180 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_188);
    name._M_dataplus._M_p = (pointer)&name.field_2;
    psVar10 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar10) {
      name.field_2._M_allocated_capacity = *psVar10;
      name.field_2._8_8_ = plVar5[3];
    }
    else {
      name.field_2._M_allocated_capacity = *psVar10;
      name._M_dataplus._M_p = (pointer)*plVar5;
    }
    name._M_string_length = plVar5[1];
    *plVar5 = (long)psVar10;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (local_188 != &local_178) {
      operator_delete(local_188,local_178 + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    pTVar6 = (TextureWrapCase *)operator_new(0x118);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    TextureWrapCase::TextureWrapCase
              (pTVar6,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               pCVar1->m_renderCtx,pCVar1->m_contextInfo,name._M_dataplus._M_p,
               ::glcts::fixed_sample_locations_values + 1,0x812f,0x812f,
               init::filteringModes[lVar11].mode,init::filteringModes[lVar11].mode,&npotFilenames);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
    }
    lVar11 = 1;
    bVar2 = false;
  } while (bVar14);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&npotFilenames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&potFilenames);
  return extraout_EAX;
}

Assistant:

void TextureWrapTests::init (void)
{
	static const struct
	{
		const char*		name;
		deUint32		mode;
	} wrapModes[] =
	{
		{ "clamp",		GL_CLAMP_TO_EDGE },
		{ "repeat",		GL_REPEAT },
		{ "mirror",		GL_MIRRORED_REPEAT }
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} filteringModes[] =
	{
		{ "nearest",	GL_NEAREST },
		{ "linear",		GL_LINEAR }
	};

	static const struct
	{
		const char*		name;
		int				width;
		int				height;
	} sizes[] =
	{
		{ "pot",		64, 128 },
		{ "npot",		63, 112 }
	};

	static const struct
	{
		const char*		name;
		deUint32		format;
		deUint32		dataType;
	} formats[] =
	{
		{ "rgba8888",	GL_RGBA,			GL_UNSIGNED_BYTE },
		{ "rgb888",		GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba4444",	GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4 },
		{ "l8",			GL_LUMINANCE,		GL_UNSIGNED_BYTE },
	};

#define FOR_EACH(ITERATOR, ARRAY, BODY)	\
	for (int (ITERATOR) = 0; (ITERATOR) < DE_LENGTH_OF_ARRAY(ARRAY); (ITERATOR)++)	\
		BODY

	FOR_EACH(wrapS,		wrapModes,
	FOR_EACH(wrapT,		wrapModes,
	FOR_EACH(filter,	filteringModes,
	FOR_EACH(size,		sizes,
	FOR_EACH(format,	formats,
		{
			bool is_clamp_clamp		= (wrapModes[wrapS].mode == GL_CLAMP_TO_EDGE	&& wrapModes[wrapT].mode == GL_CLAMP_TO_EDGE);
			bool is_repeat_mirror	= (wrapModes[wrapS].mode == GL_REPEAT			&& wrapModes[wrapT].mode == GL_MIRRORED_REPEAT);

			if (!is_clamp_clamp && !is_repeat_mirror && format != 0)
				continue; // Use other format varants with clamp_clamp & repeat_mirror pair only.

			if (!is_clamp_clamp && (!deIsPowerOfTwo32(sizes[size].width) || !deIsPowerOfTwo32(sizes[size].height)))
				continue; // Not supported as described in Spec section 3.8.2.

			string name = string("") + wrapModes[wrapS].name + "_" + wrapModes[wrapT].name + "_" + filteringModes[filter].name + "_" + sizes[size].name + "_" + formats[format].name;
			addChild(new TextureWrapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), name.c_str(), "",
										 formats[format].format, formats[format].dataType,
										 wrapModes[wrapS].mode,
										 wrapModes[wrapT].mode,
										 filteringModes[filter].mode, filteringModes[filter].mode,
										 sizes[size].width, sizes[size].height));

		})))));

	// Power-of-two ETC1 texture
	std::vector<std::string> potFilenames;
	potFilenames.push_back("data/etc1/photo_helsinki_mip_0.pkm");

	FOR_EACH(wrapS,		wrapModes,
	FOR_EACH(wrapT,		wrapModes,
	FOR_EACH(filter,	filteringModes,
		{
			string name = string("") + wrapModes[wrapS].name + "_" + wrapModes[wrapT].name + "_" + filteringModes[filter].name + "_pot_etc1";
			addChild(new TextureWrapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), name.c_str(), "",
										 wrapModes[wrapS].mode,
										 wrapModes[wrapT].mode,
										 filteringModes[filter].mode, filteringModes[filter].mode,
										 potFilenames));

		})));

	std::vector<std::string> npotFilenames;
	npotFilenames.push_back("data/etc1/photo_helsinki_113x89.pkm");

	// NPOT ETC1 texture
	for (int filter = 0; filter < DE_LENGTH_OF_ARRAY(filteringModes); filter++)
	{
		string name = string("clamp_clamp_") + filteringModes[filter].name + "_npot_etc1";
		addChild(new TextureWrapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), name.c_str(), "",
									 GL_CLAMP_TO_EDGE, GL_CLAMP_TO_EDGE,
									 filteringModes[filter].mode, filteringModes[filter].mode,
									 npotFilenames));
	}
}